

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE
qpdf_oh_get_page_content_data(qpdf_data qpdf,qpdf_oh page_oh,uchar **bufp,size_t *len)

{
  QPDF_ERROR_CODE QVar1;
  anon_class_24_3_54ff486a local_60;
  function<void_(_qpdf_data_*)> local_48;
  size_t *local_28;
  size_t *len_local;
  uchar **bufp_local;
  qpdf_data p_Stack_10;
  qpdf_oh page_oh_local;
  qpdf_data qpdf_local;
  
  local_60.page_oh = page_oh;
  local_60.bufp = bufp;
  local_60.len = len;
  local_28 = len;
  len_local = (size_t *)bufp;
  bufp_local._4_4_ = page_oh;
  p_Stack_10 = qpdf;
  std::function<void(_qpdf_data*)>::function<qpdf_oh_get_page_content_data::__0,void>
            ((function<void(_qpdf_data*)> *)&local_48,&local_60);
  QVar1 = trap_errors(qpdf,&local_48);
  std::function<void_(_qpdf_data_*)>::~function(&local_48);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_oh_get_page_content_data(qpdf_data qpdf, qpdf_oh page_oh, unsigned char** bufp, size_t* len)
{
    return trap_errors(qpdf, [page_oh, bufp, len](qpdf_data q) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_page_content_data");
        auto o = qpdf_oh_item_internal(q, page_oh);
        Pl_Buffer buf("page contents");
        o.pipePageContents(&buf);
        buf.getMallocBuffer(bufp, len);
    });
}